

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::Utils::texture::create
          (texture *this,GLuint width,GLuint height,GLuint depth,GLenum internal_format,
          TEXTURE_TYPES texture_type)

{
  TEXTURE_TYPES TVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  socklen_t __len;
  sockaddr *__addr;
  GLenum target;
  Functions *gl;
  TEXTURE_TYPES texture_type_local;
  GLenum internal_format_local;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  texture *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  release(this);
  this->m_texture_type = texture_type;
  GVar3 = getTextureTartet(this->m_texture_type);
  (**(code **)(lVar6 + 0x6f8))(1,this);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  iVar2 = 0x2b5ec6d;
  __len = 0x4844;
  glu::checkError(dVar4,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4844);
  bind(this,iVar2,__addr,__len);
  TVar1 = this->m_texture_type;
  if (1 < TVar1 - TEX_2D) {
    if (TVar1 - TEX_2D_ARRAY < 2) {
      (**(code **)(lVar6 + 0x1398))(GVar3,1,internal_format,width,height,depth);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"TexStorage3D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                      ,0x4858);
      return;
    }
    if (TVar1 != TEX_CUBE) {
      if (TVar1 == TEX_1D) {
        (**(code **)(lVar6 + 0x1370))(GVar3,1,internal_format,width);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"TexStorage1D",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                        ,0x484c);
        return;
      }
      if (TVar1 != TEX_1D_ARRAY) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invliad enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                   ,0x485b);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
  }
  (**(code **)(lVar6 + 0x1380))(GVar3,1,internal_format,width,height);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"TexStorage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4853);
  return;
}

Assistant:

void Utils::texture::create(GLuint width, GLuint height, GLuint depth, GLenum internal_format,
							TEXTURE_TYPES texture_type)
{
	static const GLuint levels = 1;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	release();

	m_texture_type = texture_type;

	GLenum target = getTextureTartet(m_texture_type);

	gl.genTextures(1, &m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	bind();

	switch (m_texture_type)
	{
	case TEX_1D:
		gl.texStorage1D(target, levels, internal_format, width);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage1D");
		break;
	case TEX_2D:
	case TEX_1D_ARRAY:
	case TEX_2D_RECT:
	case TEX_CUBE:
		gl.texStorage2D(target, levels, internal_format, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
		break;
	case TEX_3D:
	case TEX_2D_ARRAY:
		gl.texStorage3D(target, levels, internal_format, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage3D");
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}